

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gzvprintf(gzFile file,char *format,__va_list_tag *va)

{
  int iVar1;
  uint uVar2;
  uchar **ppuVar3;
  uchar *__s;
  z_streamp strm;
  gz_statep state;
  char *next;
  uint left;
  int len;
  __va_list_tag *va_local;
  char *format_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0xfffffffe;
  }
  else {
    ppuVar3 = &file[5].next;
    if ((file[1].have == 0x79b1) && (*(int *)((long)&file[4].pos + 4) == 0)) {
      if (((int)file[1].pos == 0) && (iVar1 = gz_init((gz_statep)file), iVar1 == -1)) {
        file_local._4_4_ = *(uint *)((long)&file[4].pos + 4);
      }
      else {
        if ((int)file[4].pos != 0) {
          *(undefined4 *)&file[4].pos = 0;
          iVar1 = gz_zero((gz_statep)file,(long)file[4].next);
          if (iVar1 == -1) {
            return *(int *)((long)&file[4].pos + 4);
          }
        }
        if ((int)file[5].pos == 0) {
          *ppuVar3 = *(uchar **)(file + 2);
        }
        __s = *ppuVar3 + (ulong)(uint)file[5].pos + (*(long *)(file + 2) - *(long *)(file + 2));
        __s[(int)file[1].pos - 1] = '\0';
        file_local._4_4_ = vsnprintf((char *)__s,(ulong)(uint)file[1].pos,format,va);
        if (((file_local._4_4_ == 0) || ((uint)file[1].pos <= file_local._4_4_)) ||
           (__s[(int)file[1].pos - 1] != '\0')) {
          file_local._4_4_ = 0;
        }
        else {
          *(uint *)&file[5].pos = file_local._4_4_ + (int)file[5].pos;
          file->pos = (long)(int)file_local._4_4_ + file->pos;
          if ((uint)file[1].pos <= (uint)file[5].pos) {
            uVar2 = (int)file[5].pos - (int)file[1].pos;
            *(int *)&file[5].pos = (int)file[1].pos;
            iVar1 = gz_comp((gz_statep)file,0);
            if (iVar1 == -1) {
              file_local._4_4_ = *(uint *)((long)&file[4].pos + 4);
            }
            else {
              memmove(*(void **)(file + 2),(void *)(*(long *)(file + 2) + (ulong)(uint)file[1].pos),
                      (ulong)uVar2);
              *ppuVar3 = *(uchar **)(file + 2);
              *(uint *)&file[5].pos = uVar2;
            }
          }
        }
      }
    }
    else {
      file_local._4_4_ = 0xfffffffe;
    }
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORTVA gzvprintf(gzFile file, const char *format, va_list va) {
    int len;
    unsigned left;
    char *next;
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* make sure we have some buffer space */
    if (state->size == 0 && gz_init(state) == -1)
        return state->err;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* do the printf() into the input buffer, put length in len -- the input
       buffer is double-sized just for this function, so there is guaranteed to
       be state->size bytes available after the current contents */
    if (strm->avail_in == 0)
        strm->next_in = state->in;
    next = (char *)(state->in + (strm->next_in - state->in) + strm->avail_in);
    next[state->size - 1] = 0;
#ifdef NO_vsnprintf
#  ifdef HAS_vsprintf_void
    (void)vsprintf(next, format, va);
    for (len = 0; len < state->size; len++)
        if (next[len] == 0) break;
#  else
    len = vsprintf(next, format, va);
#  endif
#else
#  ifdef HAS_vsnprintf_void
    (void)vsnprintf(next, state->size, format, va);
    len = strlen(next);
#  else
    len = vsnprintf(next, state->size, format, va);
#  endif
#endif

    /* check that printf() results fit in buffer */
    if (len == 0 || (unsigned)len >= state->size || next[state->size - 1] != 0)
        return 0;

    /* update buffer and position, compress first half if past that */
    strm->avail_in += (unsigned)len;
    state->x.pos += len;
    if (strm->avail_in >= state->size) {
        left = strm->avail_in - state->size;
        strm->avail_in = state->size;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return state->err;
        memmove(state->in, state->in + state->size, left);
        strm->next_in = state->in;
        strm->avail_in = left;
    }
    return len;
}